

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

matches * atomopl(disctx *ctx,ull *a,ull *m,void *v,int spos)

{
  int *in_RCX;
  long in_RDI;
  matches *res;
  int in_stack_00000084;
  matches *local_8;
  
  if (*(int *)(in_RDI + 0x48) == 0) {
    *(int *)(in_RDI + 0x40) = *in_RCX;
    local_8 = (matches *)0x0;
  }
  else {
    local_8 = alwaysmatches(in_stack_00000084);
    local_8->m->oplen = *in_RCX;
  }
  return local_8;
}

Assistant:

struct matches *atomopl APROTO {
	if (!ctx->reverse) {
		ctx->oplen = *(int*)v;
		return NULL;
	} else {
		struct matches *res = alwaysmatches(spos);
		res->m[0].oplen = *(int*)v;
		return res;
	}
}